

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.h
# Opt level: O3

VRDataIndex * __thiscall
MinVR::VRDataQueueItem::getData(VRDataIndex *__return_storage_ptr__,VRDataQueueItem *this)

{
  pointer pcVar1;
  string local_38;
  
  if (this->_dataIndex == (VRDataIndex *)0x0) {
    pcVar1 = (this->_serialData)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->_serialData)._M_string_length);
    VRDataIndex::VRDataIndex(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    VRDataIndex::VRDataIndex(__return_storage_ptr__,this->_dataIndex);
  }
  return __return_storage_ptr__;
}

Assistant:

VRDataIndex getData() const {
    if (_dataIndex) {
      return *_dataIndex;
    } else {
      return VRDataIndex(_serialData);
    }
  }